

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

bool __thiscall
GdlBinaryExpression::CheckTypeAndUnits(GdlBinaryExpression *this,ExpressionType *pexptRet)

{
  bool bVar1;
  ulong uVar2;
  ExpressionType *in_RSI;
  long in_RDI;
  ExpressionType expt2;
  ExpressionType expt1;
  string *in_stack_fffffffffffff4e0;
  GrcSymbolTableEntry *in_stack_fffffffffffff4e8;
  allocator *paVar3;
  string *in_stack_fffffffffffff508;
  allocator *in_stack_fffffffffffff510;
  undefined7 in_stack_fffffffffffff518;
  undefined1 in_stack_fffffffffffff51f;
  GdlObject *in_stack_fffffffffffff520;
  GrcSymbolTableEntry *in_stack_fffffffffffff528;
  int iVar4;
  undefined7 in_stack_fffffffffffff530;
  undefined1 in_stack_fffffffffffff537;
  undefined8 in_stack_fffffffffffff538;
  GrcErrorList *in_stack_fffffffffffff540;
  bool local_a9a;
  bool local_a3a;
  bool local_99a;
  bool local_942;
  bool local_8a2;
  bool local_7e2;
  string local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [39];
  allocator local_779;
  string local_778 [32];
  string local_758 [37];
  byte local_733;
  byte local_732;
  allocator local_731;
  string local_730 [37];
  byte local_70b;
  byte local_70a;
  undefined1 local_709 [38];
  byte local_6e3;
  byte local_6e2;
  allocator local_6e1;
  string local_6e0 [37];
  byte local_6bb;
  byte local_6ba;
  allocator local_6b9;
  string local_6b8 [39];
  allocator local_691;
  string local_690 [39];
  allocator local_669;
  string local_668 [32];
  string local_648 [39];
  allocator local_621;
  string local_620 [39];
  allocator local_5f9;
  string local_5f8 [32];
  string local_5d8 [39];
  allocator local_5b1;
  string local_5b0 [37];
  byte local_58b;
  byte local_58a;
  allocator local_589;
  string local_588 [39];
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [37];
  byte local_513;
  byte local_512;
  allocator local_511;
  string local_510 [37];
  byte local_4eb;
  byte local_4ea;
  allocator local_4e9;
  string local_4e8 [37];
  byte local_4c3;
  byte local_4c2;
  allocator local_4c1;
  string local_4c0 [37];
  byte local_49b;
  byte local_49a;
  allocator local_499;
  string local_498 [37];
  byte local_473;
  byte local_472;
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [37];
  byte local_38b;
  byte local_38a;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [37];
  byte local_24b;
  byte local_24a;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [32];
  string local_168 [39];
  allocator local_141;
  string local_140 [37];
  byte local_11b;
  byte local_11a;
  allocator local_119;
  string local_118 [37];
  byte local_f3;
  byte local_f2;
  allocator local_f1;
  string local_f0 [37];
  byte local_cb;
  byte local_ca;
  allocator local_c9;
  string local_c8 [37];
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [37];
  byte local_7b;
  byte local_7a;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  ExpressionType local_20;
  ExpressionType local_1c;
  ExpressionType *local_18;
  bool local_1;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffff538 >> 0x20);
  local_18 = in_RSI;
  uVar2 = (**(code **)(**(long **)(in_RDI + 0x40) + 0x50))(*(long **)(in_RDI + 0x40),&local_1c);
  if ((uVar2 & 1) == 0) {
    local_1 = false;
  }
  else {
    uVar2 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x50))(*(long **)(in_RDI + 0x48),&local_20);
    if ((uVar2 & 1) == 0) {
      local_1 = false;
    }
    else {
      *local_18 = local_1c;
      std::allocator<char>::allocator();
      local_7a = 0;
      local_7b = 0;
      local_a2 = 0;
      local_a3 = 0;
      local_ca = 0;
      local_cb = 0;
      local_f2 = 0;
      local_f3 = 0;
      local_11a = 0;
      local_11b = 0;
      std::__cxx11::string::string(local_40,"+",&local_41);
      bVar1 = GrcSymbolTableEntry::MatchesOp(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
      local_7e2 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_7a = 1;
        std::__cxx11::string::string(local_78,"-",&local_79);
        local_7b = 1;
        bVar1 = GrcSymbolTableEntry::MatchesOp(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
        local_7e2 = true;
        if (!bVar1) {
          std::allocator<char>::allocator();
          local_a2 = 1;
          std::__cxx11::string::string(local_a0,"*",&local_a1);
          local_a3 = 1;
          bVar1 = GrcSymbolTableEntry::MatchesOp
                            (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
          local_7e2 = true;
          if (!bVar1) {
            std::allocator<char>::allocator();
            local_ca = 1;
            std::__cxx11::string::string(local_c8,"/",&local_c9);
            local_cb = 1;
            bVar1 = GrcSymbolTableEntry::MatchesOp
                              (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
            local_7e2 = true;
            if (!bVar1) {
              std::allocator<char>::allocator();
              local_f2 = 1;
              std::__cxx11::string::string(local_f0,"&",&local_f1);
              local_f3 = 1;
              bVar1 = GrcSymbolTableEntry::MatchesOp
                                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
              local_7e2 = true;
              if (!bVar1) {
                std::allocator<char>::allocator();
                local_11a = 1;
                std::__cxx11::string::string(local_118,"|",&local_119);
                local_11b = 1;
                local_7e2 = GrcSymbolTableEntry::MatchesOp
                                      (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
              }
            }
          }
        }
      }
      if ((local_11b & 1) != 0) {
        std::__cxx11::string::~string(local_118);
      }
      if ((local_11a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
      }
      if ((local_f3 & 1) != 0) {
        std::__cxx11::string::~string(local_f0);
      }
      if ((local_f2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      }
      if ((local_cb & 1) != 0) {
        std::__cxx11::string::~string(local_c8);
      }
      if ((local_ca & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      }
      if ((local_a3 & 1) != 0) {
        std::__cxx11::string::~string(local_a0);
      }
      if ((local_a2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
      if ((local_7b & 1) != 0) {
        std::__cxx11::string::~string(local_78);
      }
      if ((local_7a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
      }
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_7e2 == false) {
        std::allocator<char>::allocator();
        local_38a = 0;
        local_38b = 0;
        std::__cxx11::string::string(local_360,"&&",&local_361);
        bVar1 = GrcSymbolTableEntry::MatchesOp(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
        local_942 = true;
        if (!bVar1) {
          std::allocator<char>::allocator();
          local_38a = 1;
          std::__cxx11::string::string(local_388,"||",&local_389);
          local_38b = 1;
          local_942 = GrcSymbolTableEntry::MatchesOp
                                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
        }
        if ((local_38b & 1) != 0) {
          std::__cxx11::string::~string(local_388);
        }
        if ((local_38a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_389);
        }
        std::__cxx11::string::~string(local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
        if (local_942 == false) {
          std::allocator<char>::allocator();
          local_472 = 0;
          local_473 = 0;
          local_49a = 0;
          local_49b = 0;
          local_4c2 = 0;
          local_4c3 = 0;
          local_4ea = 0;
          local_4eb = 0;
          local_512 = 0;
          local_513 = 0;
          std::__cxx11::string::string(local_448,"==",&local_449);
          bVar1 = GrcSymbolTableEntry::MatchesOp
                            (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
          local_99a = true;
          if (!bVar1) {
            std::allocator<char>::allocator();
            local_472 = 1;
            std::__cxx11::string::string(local_470,"!=",&local_471);
            local_473 = 1;
            bVar1 = GrcSymbolTableEntry::MatchesOp
                              (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
            local_99a = true;
            if (!bVar1) {
              std::allocator<char>::allocator();
              local_49a = 1;
              std::__cxx11::string::string(local_498,"<",&local_499);
              local_49b = 1;
              bVar1 = GrcSymbolTableEntry::MatchesOp
                                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
              local_99a = true;
              if (!bVar1) {
                std::allocator<char>::allocator();
                local_4c2 = 1;
                std::__cxx11::string::string(local_4c0,"<=",&local_4c1);
                local_4c3 = 1;
                bVar1 = GrcSymbolTableEntry::MatchesOp
                                  (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
                local_99a = true;
                if (!bVar1) {
                  std::allocator<char>::allocator();
                  local_4ea = 1;
                  std::__cxx11::string::string(local_4e8,">",&local_4e9);
                  local_4eb = 1;
                  bVar1 = GrcSymbolTableEntry::MatchesOp
                                    (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
                  local_99a = true;
                  if (!bVar1) {
                    std::allocator<char>::allocator();
                    local_512 = 1;
                    std::__cxx11::string::string(local_510,">=",&local_511);
                    local_513 = 1;
                    local_99a = GrcSymbolTableEntry::MatchesOp
                                          (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
                  }
                }
              }
            }
          }
          if ((local_513 & 1) != 0) {
            std::__cxx11::string::~string(local_510);
          }
          if ((local_512 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_511);
          }
          if ((local_4eb & 1) != 0) {
            std::__cxx11::string::~string(local_4e8);
          }
          if ((local_4ea & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
          }
          if ((local_4c3 & 1) != 0) {
            std::__cxx11::string::~string(local_4c0);
          }
          if ((local_4c2 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
          }
          if ((local_49b & 1) != 0) {
            std::__cxx11::string::~string(local_498);
          }
          if ((local_49a & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_499);
          }
          if ((local_473 & 1) != 0) {
            std::__cxx11::string::~string(local_470);
          }
          if ((local_472 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_471);
          }
          std::__cxx11::string::~string(local_448);
          std::allocator<char>::~allocator((allocator<char> *)&local_449);
          if (local_99a == false) {
            std::allocator<char>::allocator();
            local_58a = 0;
            local_58b = 0;
            std::__cxx11::string::string(local_560,"max",&local_561);
            bVar1 = GrcSymbolTableEntry::MatchesOp
                              (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
            local_a3a = true;
            if (!bVar1) {
              std::allocator<char>::allocator();
              local_58a = 1;
              std::__cxx11::string::string(local_588,"min",&local_589);
              local_58b = 1;
              local_a3a = GrcSymbolTableEntry::MatchesOp
                                    (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
            }
            if ((local_58b & 1) != 0) {
              std::__cxx11::string::~string(local_588);
            }
            if ((local_58a & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&local_589);
            }
            std::__cxx11::string::~string(local_560);
            std::allocator<char>::~allocator((allocator<char> *)&local_561);
            if (local_a3a == false) {
              std::allocator<char>::allocator();
              local_6ba = 0;
              local_6bb = 0;
              local_6e2 = 0;
              local_6e3 = 0;
              local_70a = 0;
              local_70b = 0;
              local_732 = 0;
              local_733 = 0;
              std::__cxx11::string::string(local_690,"=",&local_691);
              bVar1 = GrcSymbolTableEntry::MatchesOp
                                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
              local_a9a = true;
              if (!bVar1) {
                std::allocator<char>::allocator();
                local_6ba = 1;
                std::__cxx11::string::string(local_6b8,"+=",&local_6b9);
                local_6bb = 1;
                bVar1 = GrcSymbolTableEntry::MatchesOp
                                  (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
                local_a9a = true;
                if (!bVar1) {
                  paVar3 = &local_6e1;
                  std::allocator<char>::allocator();
                  local_6e2 = 1;
                  std::__cxx11::string::string(local_6e0,"-=",paVar3);
                  local_6e3 = 1;
                  in_stack_fffffffffffff537 =
                       GrcSymbolTableEntry::MatchesOp
                                 (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
                  local_a9a = true;
                  if (!(bool)in_stack_fffffffffffff537) {
                    in_stack_fffffffffffff520 = *(GdlObject **)(in_RDI + 0x38);
                    in_stack_fffffffffffff528 = (GrcSymbolTableEntry *)local_709;
                    std::allocator<char>::allocator();
                    local_70a = 1;
                    std::__cxx11::string::string
                              ((string *)(local_709 + 1),"*=",(allocator *)in_stack_fffffffffffff528
                              );
                    local_70b = 1;
                    in_stack_fffffffffffff51f =
                         GrcSymbolTableEntry::MatchesOp
                                   (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
                    local_a9a = true;
                    if (!(bool)in_stack_fffffffffffff51f) {
                      in_stack_fffffffffffff510 = &local_731;
                      std::allocator<char>::allocator();
                      local_732 = 1;
                      std::__cxx11::string::string(local_730,"/=",in_stack_fffffffffffff510);
                      local_733 = 1;
                      local_a9a = GrcSymbolTableEntry::MatchesOp
                                            (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
                    }
                  }
                }
              }
              if ((local_733 & 1) != 0) {
                std::__cxx11::string::~string(local_730);
              }
              if ((local_732 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_731);
              }
              if ((local_70b & 1) != 0) {
                std::__cxx11::string::~string((string *)(local_709 + 1));
              }
              if ((local_70a & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)local_709);
              }
              if ((local_6e3 & 1) != 0) {
                std::__cxx11::string::~string(local_6e0);
              }
              if ((local_6e2 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
              }
              if ((local_6bb & 1) != 0) {
                std::__cxx11::string::~string(local_6b8);
              }
              if ((local_6ba & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
              }
              std::__cxx11::string::~string(local_690);
              std::allocator<char>::~allocator((allocator<char> *)&local_691);
              if (local_a9a == false) {
                paVar3 = &local_7a1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_7a0,"Invalid binary operator: ",paVar3);
                GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffff528);
                GrcErrorList::AddError
                          ((GrcErrorList *)
                           CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                           (int)((ulong)in_stack_fffffffffffff528 >> 0x20),in_stack_fffffffffffff520
                           ,(string *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                           (string *)in_stack_fffffffffffff510);
                std::__cxx11::string::~string(local_7c8);
                std::__cxx11::string::~string(local_7a0);
                std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
                return false;
              }
              GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffff528);
              iVar4 = (int)((ulong)in_stack_fffffffffffff528 >> 0x20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_778," assignment operator not permitted in expression",&local_779);
              GrcErrorList::AddError
                        ((GrcErrorList *)
                         CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),iVar4,
                         in_stack_fffffffffffff520,
                         (string *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                         (string *)in_stack_fffffffffffff510);
              std::__cxx11::string::~string(local_778);
              std::allocator<char>::~allocator((allocator<char> *)&local_779);
              std::__cxx11::string::~string(local_758);
              return false;
            }
            if (((local_1c != kexptNumber) && (local_1c != kexptMeas)) &&
               ((((local_1c != kexptSlotRef && ((local_1c != kexptZero && (local_1c != kexptOne))))
                 && (local_20 != kexptNumber)) &&
                ((((local_20 != kexptMeas && (local_20 != kexptSlotRef)) && (local_20 != kexptZero))
                 && (local_20 != kexptOne)))))) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_5b0,"Numeric expression expected as target of ",&local_5b1);
              GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffff528);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_5f8," function",&local_5f9);
              GrcErrorList::AddWarning
                        ((GrcErrorList *)
                         CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                         (int)((ulong)in_stack_fffffffffffff528 >> 0x20),in_stack_fffffffffffff520,
                         (string *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                         (string *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
              std::__cxx11::string::~string(local_5f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
              std::__cxx11::string::~string(local_5d8);
              std::__cxx11::string::~string(local_5b0);
              std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
            }
            bVar1 = EquivalentTypes(local_1c,local_20);
            if (((!bVar1) && (local_1c != kexptUnknown)) && (local_20 != kexptUnknown)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_620,"Calculating ",&local_621);
              GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffff528);
              iVar4 = (int)((ulong)in_stack_fffffffffffff528 >> 0x20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_668," of different expression types",&local_669);
              GrcErrorList::AddWarning
                        ((GrcErrorList *)
                         CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),iVar4,
                         in_stack_fffffffffffff520,
                         (string *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                         (string *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
              std::__cxx11::string::~string(local_668);
              std::allocator<char>::~allocator((allocator<char> *)&local_669);
              std::__cxx11::string::~string(local_648);
              std::__cxx11::string::~string(local_620);
              std::allocator<char>::~allocator((allocator<char> *)&local_621);
            }
          }
          else {
            bVar1 = EquivalentTypes(local_1c,local_20);
            if (((!bVar1) && (local_1c != kexptUnknown)) && (local_20 != kexptUnknown)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_538,"Comparing expressions of different types",&local_539);
              GrcErrorList::AddWarning
                        (in_stack_fffffffffffff540,iVar4,
                         (GdlObject *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                         &in_stack_fffffffffffff528->m_staFieldName);
              std::__cxx11::string::~string(local_538);
              std::allocator<char>::~allocator((allocator<char> *)&local_539);
            }
            *local_18 = kexptBoolean;
          }
        }
        else {
          if ((((local_1c != kexptBoolean) && (local_1c != kexptZero)) && (local_1c != kexptOne)) ||
             (((local_20 != kexptBoolean && (local_20 != kexptZero)) && (local_20 != kexptOne)))) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_3b0,"Boolean expression expected as target of ",&local_3b1);
            GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffff528);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3f8," operator",&local_3f9);
            GrcErrorList::AddWarning
                      ((GrcErrorList *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530)
                       ,(int)((ulong)in_stack_fffffffffffff528 >> 0x20),in_stack_fffffffffffff520,
                       (string *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                       (string *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
            std::__cxx11::string::~string(local_3f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
            std::__cxx11::string::~string(local_3d8);
            std::__cxx11::string::~string(local_3b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
          }
          bVar1 = EquivalentTypes(local_1c,local_20);
          if (((!bVar1) && (local_1c != kexptUnknown)) && (local_20 != kexptUnknown)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_420,"Logically combining expressions of different types",&local_421);
            GrcErrorList::AddWarning
                      (in_stack_fffffffffffff540,iVar4,
                       (GdlObject *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                       &in_stack_fffffffffffff528->m_staFieldName);
            std::__cxx11::string::~string(local_420);
            std::allocator<char>::~allocator((allocator<char> *)&local_421);
          }
          *local_18 = kexptBoolean;
        }
      }
      else {
        if ((local_1c == kexptSlotRef) || (local_20 == kexptSlotRef)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_140,"Using \'",&local_141);
          GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffff528);
          iVar4 = (int)((ulong)in_stack_fffffffffffff528 >> 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_188,"\' operator with slot indices",&local_189);
          GrcErrorList::AddError
                    ((GrcErrorList *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                     iVar4,in_stack_fffffffffffff520,
                     (string *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     (string *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
          std::__cxx11::string::~string(local_188);
          std::allocator<char>::~allocator((allocator<char> *)&local_189);
          std::__cxx11::string::~string(local_168);
          std::__cxx11::string::~string(local_140);
          std::allocator<char>::~allocator((allocator<char> *)&local_141);
          return false;
        }
        if (((((local_1c != kexptNumber) && (local_1c != kexptMeas)) && (local_1c != kexptZero)) &&
            (local_1c != kexptOne)) ||
           (((local_20 != kexptNumber && (local_20 != kexptMeas)) &&
            ((local_20 != kexptZero && (local_20 != kexptOne)))))) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1b0,"Numeric expression expected as target of ",&local_1b1);
          GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffff528);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f8," operator.",&local_1f9);
          GrcErrorList::AddWarning
                    ((GrcErrorList *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                     (int)((ulong)in_stack_fffffffffffff528 >> 0x20),in_stack_fffffffffffff520,
                     (string *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     (string *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
          std::__cxx11::string::~string(local_1f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
          std::__cxx11::string::~string(local_1d8);
          std::__cxx11::string::~string(local_1b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        }
        std::allocator<char>::allocator();
        local_24a = 0;
        local_24b = 0;
        std::__cxx11::string::string(local_220,"+",&local_221);
        bVar1 = GrcSymbolTableEntry::MatchesOp(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
        local_8a2 = true;
        if (!bVar1) {
          std::allocator<char>::allocator();
          local_24a = 1;
          std::__cxx11::string::string(local_248,"-",&local_249);
          local_24b = 1;
          local_8a2 = GrcSymbolTableEntry::MatchesOp
                                (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
        }
        if ((local_24b & 1) != 0) {
          std::__cxx11::string::~string(local_248);
        }
        if ((local_24a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_249);
        }
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        if (local_8a2 == false) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_298,"*",&local_299);
          bVar1 = GrcSymbolTableEntry::MatchesOp
                            (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
          std::__cxx11::string::~string(local_298);
          std::allocator<char>::~allocator((allocator<char> *)&local_299);
          if (bVar1) {
            if ((local_1c == kexptMeas) && (local_20 == kexptMeas)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2c0,"Multiplying two measurements",&local_2c1);
              GrcErrorList::AddWarning
                        (in_stack_fffffffffffff540,iVar4,
                         (GdlObject *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                         &in_stack_fffffffffffff528->m_staFieldName);
              std::__cxx11::string::~string(local_2c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
            }
            if ((local_1c == kexptMeas) || (local_20 == kexptMeas)) {
              *local_18 = kexptMeas;
            }
            else {
              *local_18 = kexptNumber;
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2e8,"/",&local_2e9);
            bVar1 = GrcSymbolTableEntry::MatchesOp
                              (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
            std::__cxx11::string::~string(local_2e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
            if (bVar1) {
              if (local_20 == kexptMeas) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_310,"Divisor is a measurement",&local_311);
                GrcErrorList::AddWarning
                          (in_stack_fffffffffffff540,iVar4,
                           (GdlObject *)
                           CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                           &in_stack_fffffffffffff528->m_staFieldName);
                std::__cxx11::string::~string(local_310);
                std::allocator<char>::~allocator((allocator<char> *)&local_311);
              }
              else if (local_20 == kexptZero) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_338,"Dividing by zero",&local_339);
                GrcErrorList::AddError
                          (in_stack_fffffffffffff540,iVar4,
                           (GdlObject *)
                           CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                           &in_stack_fffffffffffff528->m_staFieldName);
                std::__cxx11::string::~string(local_338);
                std::allocator<char>::~allocator((allocator<char> *)&local_339);
              }
            }
          }
        }
        else {
          bVar1 = EquivalentTypes(local_1c,local_20);
          if (((!bVar1) && (local_1c != kexptUnknown)) && (local_20 != kexptUnknown)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_270,"Adding measurement to non-measurement",&local_271);
            GrcErrorList::AddWarning
                      (in_stack_fffffffffffff540,iVar4,
                       (GdlObject *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                       &in_stack_fffffffffffff528->m_staFieldName);
            std::__cxx11::string::~string(local_270);
            std::allocator<char>::~allocator((allocator<char> *)&local_271);
          }
        }
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool GdlBinaryExpression::CheckTypeAndUnits(ExpressionType * pexptRet)
{
	ExpressionType expt1;
	if (!m_pexpOperand1->CheckTypeAndUnits(&expt1))
		return false;
	ExpressionType expt2;
	if (!m_pexpOperand2->CheckTypeAndUnits(&expt2))
		return false;

	*pexptRet = expt1;	// unless changed below

	if (m_psymOperator->MatchesOp("+") || m_psymOperator->MatchesOp("-") ||
		m_psymOperator->MatchesOp("*") || m_psymOperator->MatchesOp("/") ||
		m_psymOperator->MatchesOp("&") || m_psymOperator->MatchesOp("|"))
	{
		//	Additive, multiplicative
		if (expt1 == kexptSlotRef || expt2 == kexptSlotRef)
		{
			g_errorList.AddError(2103, this,
				"Using '",
				m_psymOperator->FullName(),
				"' operator with slot indices");
			return false;
		}
		if ((expt1 != kexptNumber && expt1 != kexptMeas &&
				expt1 != kexptZero && expt1 != kexptOne) ||
			(expt2 != kexptNumber && expt2 != kexptMeas &&
				expt2 != kexptZero && expt2 != kexptOne))
		{
			g_errorList.AddWarning(2503, this,
				"Numeric expression expected as target of ",
				m_psymOperator->FullName(),
				" operator.");
		}

		if (m_psymOperator->MatchesOp("+") || m_psymOperator->MatchesOp("-"))
		{
			if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
				g_errorList.AddWarning(2504, this,
					"Adding measurement to non-measurement");
		}
		else if (m_psymOperator->MatchesOp("*"))
		{
			if (expt1 == kexptMeas && expt2 == kexptMeas)
				g_errorList.AddWarning(2505, this,
					"Multiplying two measurements");

			if (expt1 == kexptMeas || expt2 == kexptMeas)
				*pexptRet = kexptMeas;
			else
				*pexptRet = kexptNumber;
		}
		else if (m_psymOperator->MatchesOp("/"))
		{
			if (expt2 == kexptMeas)
				g_errorList.AddWarning(2506, this, "Divisor is a measurement");
			else if (expt2 == kexptZero)
				g_errorList.AddError(2104, this, "Dividing by zero");
		}
	}
	else if (m_psymOperator->MatchesOp("&&") || m_psymOperator->MatchesOp("||"))
	{
		//	Logical
		if ((expt1 != kexptBoolean && expt1 != kexptZero && expt1 != kexptOne) ||
			(expt2 != kexptBoolean && expt2 != kexptZero && expt2 != kexptOne))
		{
			g_errorList.AddWarning(2507, this,
				"Boolean expression expected as target of ",
				m_psymOperator->FullName(),
				" operator");
		}
		if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
			g_errorList.AddWarning(2508, this,
				"Logically combining expressions of different types");

		*pexptRet = kexptBoolean;
	}
	else if (m_psymOperator->MatchesOp("==") || m_psymOperator->MatchesOp("!=") ||
		m_psymOperator->MatchesOp("<") || m_psymOperator->MatchesOp("<=") ||
		m_psymOperator->MatchesOp(">") || m_psymOperator->MatchesOp(">="))
	{
		//	Comparative
		if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
			g_errorList.AddWarning(2509, this,
				"Comparing expressions of different types");

		*pexptRet = kexptBoolean;
	}
	else if (m_psymOperator->MatchesOp("max") || m_psymOperator->MatchesOp("min"))
	{
		//	Functional
		if (expt1 != kexptNumber && expt1 != kexptMeas &&
			expt1 != kexptSlotRef && expt1 != kexptZero && expt1 != kexptOne &&
			expt2 != kexptNumber && expt2 != kexptMeas &&
			expt2 != kexptSlotRef && expt2 != kexptZero && expt2 != kexptOne)
		{
			g_errorList.AddWarning(2510, this,
				"Numeric expression expected as target of ",
				m_psymOperator->FullName(),
				" function");
		}
		if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
			g_errorList.AddWarning(2511, this,
				"Calculating ",
				m_psymOperator->FullName(),
				" of different expression types");
	}
	else if (m_psymOperator->MatchesOp("=") ||
		m_psymOperator->MatchesOp("+=") || m_psymOperator->MatchesOp("-=") ||
		m_psymOperator->MatchesOp("*=") || m_psymOperator->MatchesOp("/="))
	{
		//	Assignment
		g_errorList.AddError(2105, this,
			m_psymOperator->FullName(),
			" assignment operator not permitted in expression");
		return false;
	}
	else
	{
		g_errorList.AddError(2106, this,
			"Invalid binary operator: ",
			m_psymOperator->FullName());
		return false;
	}

	return true;
}